

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer_impl.h
# Opt level: O3

void __thiscall QMdi::ControlContainer::updateWindowIcon(ControlContainer *this,QIcon *windowIcon)

{
  Data *pDVar1;
  QWidget *this_00;
  
  pDVar1 = (this->m_menuLabel).wp.d;
  if ((pDVar1 != (Data *)0x0) &&
     (this_00 = (QWidget *)(this->m_menuLabel).wp.value,
     this_00 != (QWidget *)0x0 && *(int *)(pDVar1 + 4) != 0)) {
    QWidget::setWindowIcon(this_00,windowIcon);
    return;
  }
  return;
}

Assistant:

bool isNull() const noexcept { return d == nullptr || d->strongref.loadRelaxed() == 0 || value == nullptr; }